

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O1

void Abc_NtkMarkFanouts_rec(Abc_Obj_t *pLut,int nLevMax,int nFanMax)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  int Fill;
  long lVar5;
  
  if ((*(uint *)&pLut->field_0x14 & 0xf) == 7) {
    pAVar3 = pLut->pNtk;
    iVar1 = pLut->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,nFanMax);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pLut->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pLut->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      if ((((int)(*(uint *)&pLut->field_0x14 >> 0xc) <= nLevMax) &&
          ((pLut->vFanouts).nSize <= nFanMax)) && (0 < (pLut->vFanouts).nSize)) {
        lVar5 = 0;
        do {
          Abc_NtkMarkFanouts_rec
                    ((Abc_Obj_t *)pLut->pNtk->vObjs->pArray[(pLut->vFanouts).pArray[lVar5]],nLevMax,
                     nFanMax);
          lVar5 = lVar5 + 1;
        } while (lVar5 < (pLut->vFanouts).nSize);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMarkFanouts_rec( Abc_Obj_t * pLut, int nLevMax, int nFanMax )
{
    Abc_Obj_t * pNext;
    int i;
    if ( !Abc_ObjIsNode(pLut) )
        return;
    if ( Abc_NodeIsTravIdCurrent( pLut ) )
        return;
    Abc_NodeSetTravIdCurrent( pLut );
    if ( Abc_ObjLevel(pLut) > nLevMax )
        return;
    if ( Abc_ObjFanoutNum(pLut) > nFanMax )
        return;
    Abc_ObjForEachFanout( pLut, pNext, i )
        Abc_NtkMarkFanouts_rec( pNext, nLevMax, nFanMax );
}